

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  size_t sVar2;
  ostream *poVar3;
  pointer pSVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar4 = pSVar4 + 1, pSVar4 != pSVar1) {
      printHeaderString(this,&pSVar4->name,2);
    }
    Colour::use(None);
  }
  pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.file = pSVar4[-1].lineInfo.file;
  local_28.line = pSVar4[-1].lineInfo.line;
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b0f60 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b0f67._0_1_ = '-';
    uRam00000000001b0f67._1_1_ = '-';
    uRam00000000001b0f67._2_1_ = '-';
    uRam00000000001b0f67._3_1_ = '-';
    uRam00000000001b0f67._4_1_ = '-';
    uRam00000000001b0f67._5_1_ = '-';
    uRam00000000001b0f67._6_1_ = '-';
    uRam00000000001b0f67._7_1_ = '-';
    DAT_001b0f50 = '-';
    DAT_001b0f50_1._0_1_ = '-';
    DAT_001b0f50_1._1_1_ = '-';
    DAT_001b0f50_1._2_1_ = '-';
    DAT_001b0f50_1._3_1_ = '-';
    DAT_001b0f50_1._4_1_ = '-';
    DAT_001b0f50_1._5_1_ = '-';
    DAT_001b0f50_1._6_1_ = '-';
    uRam00000000001b0f58 = 0x2d2d2d2d2d2d2d;
    DAT_001b0f5f = 0x2d;
    DAT_001b0f40 = '-';
    DAT_001b0f40_1._0_1_ = '-';
    DAT_001b0f40_1._1_1_ = '-';
    DAT_001b0f40_1._2_1_ = '-';
    DAT_001b0f40_1._3_1_ = '-';
    DAT_001b0f40_1._4_1_ = '-';
    DAT_001b0f40_1._5_1_ = '-';
    DAT_001b0f40_1._6_1_ = '-';
    uRam00000000001b0f48._0_1_ = '-';
    uRam00000000001b0f48._1_1_ = '-';
    uRam00000000001b0f48._2_1_ = '-';
    uRam00000000001b0f48._3_1_ = '-';
    uRam00000000001b0f48._4_1_ = '-';
    uRam00000000001b0f48._5_1_ = '-';
    uRam00000000001b0f48._6_1_ = '-';
    uRam00000000001b0f48._7_1_ = '-';
    DAT_001b0f30 = '-';
    DAT_001b0f30_1._0_1_ = '-';
    DAT_001b0f30_1._1_1_ = '-';
    DAT_001b0f30_1._2_1_ = '-';
    DAT_001b0f30_1._3_1_ = '-';
    DAT_001b0f30_1._4_1_ = '-';
    DAT_001b0f30_1._5_1_ = '-';
    DAT_001b0f30_1._6_1_ = '-';
    uRam00000000001b0f38._0_1_ = '-';
    uRam00000000001b0f38._1_1_ = '-';
    uRam00000000001b0f38._2_1_ = '-';
    uRam00000000001b0f38._3_1_ = '-';
    uRam00000000001b0f38._4_1_ = '-';
    uRam00000000001b0f38._5_1_ = '-';
    uRam00000000001b0f38._6_1_ = '-';
    uRam00000000001b0f38._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001b0f28._0_1_ = '-';
    uRam00000000001b0f28._1_1_ = '-';
    uRam00000000001b0f28._2_1_ = '-';
    uRam00000000001b0f28._3_1_ = '-';
    uRam00000000001b0f28._4_1_ = '-';
    uRam00000000001b0f28._5_1_ = '-';
    uRam00000000001b0f28._6_1_ = '-';
    uRam00000000001b0f28._7_1_ = '-';
    DAT_001b0f6f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001b1000 = 0x2e2e2e2e2e2e2e;
    uRam00000000001b1007._0_1_ = '.';
    uRam00000000001b1007._1_1_ = '.';
    uRam00000000001b1007._2_1_ = '.';
    uRam00000000001b1007._3_1_ = '.';
    uRam00000000001b1007._4_1_ = '.';
    uRam00000000001b1007._5_1_ = '.';
    uRam00000000001b1007._6_1_ = '.';
    uRam00000000001b1007._7_1_ = '.';
    DAT_001b0ff0 = '.';
    DAT_001b0ff0_1._0_1_ = '.';
    DAT_001b0ff0_1._1_1_ = '.';
    DAT_001b0ff0_1._2_1_ = '.';
    DAT_001b0ff0_1._3_1_ = '.';
    DAT_001b0ff0_1._4_1_ = '.';
    DAT_001b0ff0_1._5_1_ = '.';
    DAT_001b0ff0_1._6_1_ = '.';
    uRam00000000001b0ff8 = 0x2e2e2e2e2e2e2e;
    DAT_001b0fff = 0x2e;
    DAT_001b0fe0 = '.';
    DAT_001b0fe0_1._0_1_ = '.';
    DAT_001b0fe0_1._1_1_ = '.';
    DAT_001b0fe0_1._2_1_ = '.';
    DAT_001b0fe0_1._3_1_ = '.';
    DAT_001b0fe0_1._4_1_ = '.';
    DAT_001b0fe0_1._5_1_ = '.';
    DAT_001b0fe0_1._6_1_ = '.';
    uRam00000000001b0fe8._0_1_ = '.';
    uRam00000000001b0fe8._1_1_ = '.';
    uRam00000000001b0fe8._2_1_ = '.';
    uRam00000000001b0fe8._3_1_ = '.';
    uRam00000000001b0fe8._4_1_ = '.';
    uRam00000000001b0fe8._5_1_ = '.';
    uRam00000000001b0fe8._6_1_ = '.';
    uRam00000000001b0fe8._7_1_ = '.';
    DAT_001b0fd0 = '.';
    DAT_001b0fd0_1._0_1_ = '.';
    DAT_001b0fd0_1._1_1_ = '.';
    DAT_001b0fd0_1._2_1_ = '.';
    DAT_001b0fd0_1._3_1_ = '.';
    DAT_001b0fd0_1._4_1_ = '.';
    DAT_001b0fd0_1._5_1_ = '.';
    DAT_001b0fd0_1._6_1_ = '.';
    uRam00000000001b0fd8._0_1_ = '.';
    uRam00000000001b0fd8._1_1_ = '.';
    uRam00000000001b0fd8._2_1_ = '.';
    uRam00000000001b0fd8._3_1_ = '.';
    uRam00000000001b0fd8._4_1_ = '.';
    uRam00000000001b0fd8._5_1_ = '.';
    uRam00000000001b0fd8._6_1_ = '.';
    uRam00000000001b0fd8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001b0fc8._0_1_ = '.';
    uRam00000000001b0fc8._1_1_ = '.';
    uRam00000000001b0fc8._2_1_ = '.';
    uRam00000000001b0fc8._3_1_ = '.';
    uRam00000000001b0fc8._4_1_ = '.';
    uRam00000000001b0fc8._5_1_ = '.';
    uRam00000000001b0fc8._6_1_ = '.';
    uRam00000000001b0fc8._7_1_ = '.';
    DAT_001b100f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}